

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9ProcessCsv(char *zInput,int nByte,int delim,int encl,int escape,
                   _func_sxi32_char_ptr_int_void_ptr *xConsumer,void *pUserData)

{
  sxi32 sVar1;
  char *pcVar2;
  bool bVar3;
  int local_48;
  sxi32 rc;
  int nByte_1;
  int isEnc;
  char *zPtr;
  char *zIn;
  char *zEnd;
  _func_sxi32_char_ptr_int_void_ptr *xConsumer_local;
  int escape_local;
  int encl_local;
  int delim_local;
  int nByte_local;
  char *zInput_local;
  
  pcVar2 = zInput + nByte;
  zPtr = zInput;
  do {
    _nByte_1 = zPtr;
    if (pcVar2 <= zPtr) {
      return 0;
    }
    bVar3 = false;
    while ((zPtr < pcVar2 && ((*zPtr != delim || (bVar3))))) {
      if (*zPtr == encl) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (*zPtr == escape) {
        zPtr = zPtr + 1;
      }
      zPtr = zPtr + 1;
    }
    if (_nByte_1 < zPtr) {
      local_48 = (int)zPtr - (int)_nByte_1;
      if (*_nByte_1 == encl) {
        _nByte_1 = _nByte_1 + 1;
        local_48 = local_48 + -2;
      }
      if ((0 < local_48) && (sVar1 = (*xConsumer)(_nByte_1,local_48,pUserData), sVar1 == -10)) {
        return 0;
      }
    }
    while( true ) {
      bVar3 = false;
      if (zPtr < pcVar2) {
        bVar3 = *zPtr == delim;
      }
      if (!bVar3) break;
      zPtr = zPtr + 1;
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9ProcessCsv(
	const char *zInput, /* Raw input */
	int nByte,  /* Input length */
	int delim,  /* Delimiter */
	int encl,   /* Enclosure */
	int escape,  /* Escape character */
	sxi32 (*xConsumer)(const char *, int, void *), /* User callback */
	void *pUserData /* Last argument to xConsumer() */
	)
{
	const char *zEnd = &zInput[nByte];
	const char *zIn = zInput;
	const char *zPtr;
	int isEnc;
	/* Start processing */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		isEnc = 0;
		zPtr = zIn;
		/* Find the first delimiter */
		while( zIn < zEnd ){
			if( zIn[0] == delim && !isEnc){
				/* Delimiter found, break imediately */
				break;
			}else if( zIn[0] == encl ){
				/* Inside enclosure? */
				isEnc = !isEnc;
			}else if( zIn[0] == escape ){
				/* Escape sequence */
				zIn++;
			}
			/* Advance the cursor */
			zIn++;
		}
		if( zIn > zPtr ){
			int nByte = (int)(zIn-zPtr);
			sxi32 rc;
			/* Invoke the supllied callback */
			if( zPtr[0] == encl ){
				zPtr++;
				nByte-=2;
			}
			if( nByte > 0 ){
				rc = xConsumer(zPtr, nByte, pUserData);
				if( rc == SXERR_ABORT ){
					/* User callback request an operation abort */
					break;
				}
			}
		}
		/* Ignore trailing delimiter */
		while( zIn < zEnd && zIn[0] == delim ){
			zIn++;
		}
	}
	return SXRET_OK;
}